

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tctok.cpp
# Opt level: O0

CTcToken * __thiscall CTcTokenizer::copycur(CTcTokenizer *this)

{
  tc_toktyp_t typ;
  int iVar1;
  char *pcVar2;
  size_t len;
  CTcTokenizer *in_RDI;
  CTcToken *this_00;
  CTcTokenizer *in_stack_ffffffffffffffe0;
  CTcToken *local_8;
  
  typ = CTcToken::gettyp(&in_RDI->curtok_);
  iVar1 = is_tok_safe(in_RDI,typ);
  if (iVar1 == 0) {
    this_00 = &in_RDI->curtok_;
    pcVar2 = CTcToken::get_text(&in_RDI->curtok_);
    CTcToken::get_text_len(&in_RDI->curtok_);
    pcVar2 = store_source(in_stack_ffffffffffffffe0,(char *)this_00,(size_t)pcVar2);
    len = CTcToken::get_text_len(&in_RDI->curtok_);
    CTcToken::set_text(this_00,pcVar2,len);
    local_8 = &in_RDI->curtok_;
  }
  else {
    local_8 = getcur(in_RDI);
  }
  return local_8;
}

Assistant:

const CTcToken *CTcTokenizer::copycur()
{
    /* if it's already a type that we store safely, return the current token */
    if (is_tok_safe(curtok_.gettyp()))
        return getcur();

    /* save the current token's text in permanent tokenizer memory */
    curtok_.set_text(store_source(curtok_.get_text(), curtok_.get_text_len()),
                     curtok_.get_text_len());

    /* return the current token, now that we've made it safe */
    return &curtok_;
}